

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlAttrPtr xmlNewNsPropEatName(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value)

{
  xmlAttrPtr pxVar1;
  
  if (name != (xmlChar *)0x0) {
    pxVar1 = xmlNewPropInternal(node,ns,name,value,1);
    return pxVar1;
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

xmlAttrPtr
xmlNewNsPropEatName(xmlNodePtr node, xmlNsPtr ns, xmlChar *name,
           const xmlChar *value) {

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewNsPropEatName : name == NULL\n");
#endif
	return(NULL);
    }

    return xmlNewPropInternal(node, ns, name, value, 1);
}